

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

exr_result_t
exr_uncompress_buffer(void *in,size_t in_bytes,void *out,size_t out_bytes_avail,size_t *actual_out)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  size_t actual_in_bytes;
  libdeflate_result res;
  libdeflate_decompressor *decomp;
  long local_48;
  int local_3c;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  undefined8 local_10;
  exr_result_t local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = libdeflate_alloc_decompressor();
  if (local_38 == 0) {
    local_4 = 1;
  }
  else {
    local_3c = libdeflate_zlib_decompress_ex
                         (local_38,local_10,local_18,local_20,local_28,&local_48,local_30);
    libdeflate_free_decompressor(local_38);
    if ((local_3c == 0) && (local_18 == local_48)) {
      local_4 = 0;
    }
    else {
      local_4 = 0x17;
    }
  }
  return local_4;
}

Assistant:

exr_result_t exr_uncompress_buffer (
    const void *in,
    size_t in_bytes,
    void *out,
    size_t out_bytes_avail,
    size_t *actual_out )
{
    struct libdeflate_decompressor *decomp;
    enum libdeflate_result res;
    size_t actual_in_bytes;

    decomp = libdeflate_alloc_decompressor ();
    if (decomp)
    {
        res = libdeflate_zlib_decompress_ex (
            decomp,
            in,
            in_bytes,
            out,
            out_bytes_avail,
            &actual_in_bytes,
            actual_out);

        libdeflate_free_decompressor (decomp);

        if (res == LIBDEFLATE_SUCCESS)
        {
            if (in_bytes == actual_in_bytes)
                return EXR_ERR_SUCCESS;
            /* it's an error to not consume the full buffer, right? */
        }
        return EXR_ERR_CORRUPT_CHUNK;
    }
    return EXR_ERR_OUT_OF_MEMORY;
}